

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

void draco::parser::ParseLine(DecoderBuffer *buffer,string *out_string)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char unaff_R12B;
  
  if (out_string != (string *)0x0) {
    out_string->_M_string_length = 0;
    *(out_string->_M_dataplus)._M_p = '\0';
  }
  iVar5 = 0;
  do {
    lVar1 = buffer->pos_ + 1;
    if (buffer->data_size_ < lVar1) {
      return;
    }
    cVar2 = buffer->data_[buffer->pos_];
    if ((cVar2 == '\r') || (cVar4 = unaff_R12B, cVar2 == '\n')) {
      cVar4 = cVar2;
      if (iVar5 == 0) {
LAB_001197d2:
        iVar5 = iVar5 + 1;
        goto LAB_001197d7;
      }
      cVar4 = unaff_R12B;
      if (iVar5 == 1) {
        if (unaff_R12B != '\n' && cVar2 == '\n') goto LAB_001197d2;
        iVar5 = 1;
      }
LAB_0011980b:
      bVar3 = false;
    }
    else {
LAB_001197d7:
      if (((0 < iVar5) && (cVar2 != '\r')) && (cVar2 != '\n')) goto LAB_0011980b;
      buffer->pos_ = lVar1;
      bVar3 = true;
      if (((out_string != (string *)0x0) && (cVar2 != '\n')) && (cVar2 != '\r')) {
        std::__cxx11::string::push_back((char)out_string);
      }
    }
    unaff_R12B = cVar4;
    if (!bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void ParseLine(DecoderBuffer *buffer, std::string *out_string) {
  if (out_string) {
    out_string->clear();
  }
  char c;
  int num_delims = 0;
  char last_delim;
  while (buffer->Peek(&c)) {
    // Check if |c| is a delimiter symbol. We want to identify all possible
    // delimiters that can occur on different platforms (i.e. we want to detect
    // '\r\n', '\r', '\n').
    const bool is_delim = (c == '\r' || c == '\n');

    if (is_delim) {
      if (num_delims == 0) {
        last_delim = c;
      } else if (num_delims == 1) {
        // We already parsed either '\r' or '\n'. Ensure the new delim symbol is
        // '\n' and different from the previous symbol.
        if (c == last_delim || c != '\n') {
          return;  // Same delimiter symbol already processed.
        }
      } else {
        // Too many delimiter symbols.
        return;
      }
      num_delims++;
    }

    if (!is_delim && num_delims > 0) {
      // We reached a non-delimiter symbol after a delimiter was already found.
      // Stop the parsing.
      return;
    }

    buffer->Advance(1);

    // We put the non-delimiter symbol into the output string.
    if (!is_delim && out_string) {
      out_string->push_back(c);
    }
  }
}